

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_match.h
# Opt level: O3

bool booster::regex_search<booster::regex>(char *s,cmatch *m,regex *r,int flags)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  char cVar4;
  size_t sVar5;
  pointer local_48;
  pointer ppStack_40;
  pointer local_38;
  
  local_48 = (pointer)0x0;
  ppStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  sVar5 = strlen(s);
  cVar4 = booster::regex::search((char *)r,s,(vector *)(s + sVar5),(int)&local_48);
  if (cVar4 != '\0') {
    m->begin_ = s;
    m->end_ = s + sVar5;
    ppVar1 = (m->offsets_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppVar2 = (m->offsets_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    ppVar3 = (m->offsets_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (m->offsets_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = local_48;
    (m->offsets_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppStack_40;
    (m->offsets_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_38;
    local_48 = ppVar1;
    ppStack_40 = ppVar2;
    local_38 = ppVar3;
  }
  if (local_48 != (pointer)0x0) {
    operator_delete(local_48);
  }
  return (bool)cVar4;
}

Assistant:

bool regex_search(char const *s,cmatch &m, Regex const &r,int flags = 0)
	{
		std::vector<std::pair<int,int> > map;
		char const *begin=s;
		char const *end = begin+strlen(begin);
		bool res = r.search(begin,end,map,flags);
		if(!res) return false;
		m.assign(begin,end,map);
		return true;
	}